

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-nice-strict.h
# Opt level: O2

void __thiscall
testing::StrictMock<solitaire::archivers::HistoryTrackerMock>::StrictMock
          (StrictMock<solitaire::archivers::HistoryTrackerMock> *this)

{
  Mock::FailUninterestingCalls(this);
  memset(this,0,0x128);
  solitaire::archivers::HistoryTrackerMock::HistoryTrackerMock(&this->super_HistoryTrackerMock);
  (this->super_HistoryTrackerMock).super_HistoryTracker._vptr_HistoryTracker =
       (_func_int **)&PTR__StrictMock_002ecfa8;
  return;
}

Assistant:

StrictMock() : MockClass() {
    static_assert(sizeof(*this) == sizeof(MockClass),
                  "The impl subclass shouldn't introduce any padding");
  }